

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_upsert.cpp
# Opt level: O2

unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true> __thiscall
duckdb::Transformer::DummyOnConflictClause
          (Transformer *this,PGOnConflictActionAlias type,string *relname)

{
  pointer pOVar1;
  InternalException *this_00;
  templated_unique_single_t *result;
  undefined4 in_register_00000034;
  allocator local_39;
  string local_38;
  
  if ((int)relname == 2) {
    make_uniq<duckdb::OnConflictInfo>();
    pOVar1 = unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true>::
             operator->((unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true>
                         *)this);
    pOVar1->action_type = NOTHING;
  }
  else {
    if ((int)relname != 1) {
      this_00 = (InternalException *)
                __cxa_allocate_exception(0x10,CONCAT44(in_register_00000034,type));
      ::std::__cxx11::string::string
                ((string *)&local_38,"Type not implemented for PGOnConflictActionAlias",&local_39);
      InternalException::InternalException(this_00,&local_38);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    make_uniq<duckdb::OnConflictInfo>();
    pOVar1 = unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true>::
             operator->((unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true>
                         *)this);
    pOVar1->action_type = REPLACE;
  }
  return (unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>)
         (unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>)this;
}

Assistant:

unique_ptr<OnConflictInfo> Transformer::DummyOnConflictClause(duckdb_libpgquery::PGOnConflictActionAlias type,
                                                              const string &relname) {
	switch (type) {
	case duckdb_libpgquery::PGOnConflictActionAlias::PG_ONCONFLICT_ALIAS_REPLACE: {
		// This can not be fully resolved yet until the bind stage
		auto result = make_uniq<OnConflictInfo>();
		result->action_type = OnConflictAction::REPLACE;
		return result;
	}
	case duckdb_libpgquery::PGOnConflictActionAlias::PG_ONCONFLICT_ALIAS_IGNORE: {
		// We can just fully replace this with DO NOTHING, and be done with it
		auto result = make_uniq<OnConflictInfo>();
		result->action_type = OnConflictAction::NOTHING;
		return result;
	}
	default: {
		throw InternalException("Type not implemented for PGOnConflictActionAlias");
	}
	}
}